

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainchan.c
# Opt level: O2

void mainchan_ready(mainchan *mc)

{
  int arg;
  
  mc->ready = true;
  (*mc->cl->vt->set_wants_user_input)(mc->cl,true);
  (*mc->cl->vt->got_user_input)(mc->cl);
  if (mc->eof_pending == true) {
    mc->eof_pending = false;
    mainchan_special_cmd(mc,SS_EOF,arg);
  }
  ssh_ldisc_update(mc->ppl->ssh);
  queue_idempotent_callback(&mc->ppl->ic_process_queue);
  return;
}

Assistant:

static void mainchan_ready(mainchan *mc)
{
    mc->ready = true;

    ssh_set_wants_user_input(mc->cl, true);
    ssh_got_user_input(mc->cl); /* in case any is already queued */

    /* If an EOF arrived before we were ready, handle it now. */
    if (mc->eof_pending) {
        mc->eof_pending = false;
        mainchan_special_cmd(mc, SS_EOF, 0);
    }

    ssh_ldisc_update(mc->ppl->ssh);
    queue_idempotent_callback(&mc->ppl->ic_process_queue);
}